

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::iterate
          (ImageBindingRenderCase *this)

{
  ostringstream *this_00;
  TestType TVar1;
  uint uVar2;
  code *pcVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  ulong uVar9;
  bool imageTestPassed;
  bool queryTestPassed;
  GLint val;
  string name;
  int local_1fc;
  long local_1f8;
  uint local_1ec;
  string *local_1e8;
  long local_1e0;
  ulong local_1d8;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  iVar6 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1f8 = CONCAT44(extraout_var,iVar6);
  TVar1 = (this->super_LayoutBindingRenderCase).m_testType;
  uVar2 = (this->super_LayoutBindingRenderCase).m_numBindings;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  local_1ec = TVar1 - TESTTYPE_BINDING_ARRAY;
  local_1e8 = &(this->super_LayoutBindingRenderCase).m_uniformName;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1e0 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  local_1d8 = (ulong)uVar2;
  queryTestPassed = true;
  imageTestPassed = true;
  for (uVar9 = 0; local_1d8 != uVar9; uVar9 = uVar9 + 1) {
    (**(code **)(local_1f8 + 0x14f0))
              ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,uVar9 & 0xffffffff);
    if (local_1ec < 2) {
      getUniformName(&local_1d0,local_1e8,0,(int)uVar9);
    }
    else {
      getUniformName(&local_1d0,local_1e8,(int)uVar9);
    }
    iVar6 = (this->super_LayoutBindingRenderCase).m_bindings.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar9];
    local_1fc = -1;
    pcVar3 = *(code **)(local_1f8 + 0xb68);
    dVar8 = (((this->super_LayoutBindingRenderCase).m_program)->m_program).m_program;
    uVar7 = (**(code **)(local_1f8 + 0xb48))(dVar8,local_1d0._M_dataplus._M_p);
    (*pcVar3)(dVar8,uVar7,&local_1fc);
    local_1b0._0_8_ =
         ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Querying binding point for ");
    std::operator<<((ostream *)this_00,(string *)&local_1d0);
    std::operator<<((ostream *)this_00,": ");
    std::ostream::operator<<(this_00,local_1fc);
    std::operator<<((ostream *)this_00," == ");
    std::ostream::operator<<(this_00,iVar6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    dVar8 = (**(code **)(local_1f8 + 0x800))();
    glu::checkError(dVar8,"Binding point query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x593);
    iVar4 = local_1fc;
    bVar5 = LayoutBindingRenderCase::drawAndVerifyResult
                      (&this->super_LayoutBindingRenderCase,
                       (Vec4 *)((long)((this->m_textureColors).
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data +
                               local_1e0));
    queryTestPassed = (bool)(queryTestPassed & iVar4 == iVar6);
    imageTestPassed = (bool)(imageTestPassed & bVar5);
    std::__cxx11::string::~string((string *)&local_1d0);
    local_1e0 = local_1e0 + 0x10;
  }
  LayoutBindingRenderCase::setTestResult
            (&this->super_LayoutBindingRenderCase,queryTestPassed,imageTestPassed);
  return STOP;
}

Assistant:

TestCase::IterateResult ImageBindingRenderCase::iterate	(void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	// Set the viewport and enable the shader program
	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Set the uniform value indicating the current array index
		gl.uniform1i(m_shaderProgramArrayNdxLoc, iterNdx);

		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getUniformiv(m_program->getProgram(), gl.getUniformLocation(m_program->getProgram(), name.c_str()), &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		// Draw and verify
		if (val != binding)
			queryTestPassed = false;
		if (!drawAndVerifyResult(m_textureColors[iterNdx]))
			imageTestPassed = false;
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}